

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_get_b32(uchar *r,secp256k1_fe *a)

{
  secp256k1_fe *in_RSI;
  uchar *in_RDI;
  
  secp256k1_fe_verify(in_RSI);
  if (in_RSI->normalized == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x120,"test condition failed: a->normalized");
    abort();
  }
  secp256k1_fe_impl_get_b32(in_RDI,in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_get_b32(unsigned char *r, const secp256k1_fe *a) {
    secp256k1_fe_verify(a);
    VERIFY_CHECK(a->normalized);
    secp256k1_fe_impl_get_b32(r, a);
}